

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O2

void __thiscall libebml::EbmlMaster::~EbmlMaster(EbmlMaster *this)

{
  pointer ppEVar1;
  EbmlElement *pEVar2;
  ulong uVar3;
  
  (this->super_EbmlElement)._vptr_EbmlElement = (_func_int **)&PTR__EbmlMaster_001de6f8;
  if ((this->super_EbmlElement).bLocked == false) {
    uVar3 = 0;
    while( true ) {
      ppEVar1 = (this->ElementList).
                super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->ElementList).
                        super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) <= uVar3)
      break;
      pEVar2 = ppEVar1[uVar3];
      if (pEVar2->bLocked == false) {
        (*pEVar2->_vptr_EbmlElement[1])();
      }
      uVar3 = uVar3 + 1;
    }
    EbmlBinary::~EbmlBinary(&(this->Checksum).super_EbmlBinary);
    std::_Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
    ~_Vector_base(&(this->ElementList).
                   super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                 );
    EbmlElement::~EbmlElement(&this->super_EbmlElement);
    return;
  }
  __assert_fail("!IsLocked()",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlMaster.cpp"
                ,0x4b,"virtual libebml::EbmlMaster::~EbmlMaster()");
}

Assistant:

EbmlMaster::~EbmlMaster()
{
  assert(!IsLocked()); // you're trying to delete a locked element !!!

  size_t Index;

  for (Index = 0; Index < ElementList.size(); Index++) {
    if (!(*ElementList[Index]).IsLocked())  {
      delete ElementList[Index];
    }
  }
}